

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O0

void __thiscall dlib::mfp_kernel_1_base_class<2UL>::clear(mfp_kernel_1_base_class<2UL> *this)

{
  mfp_kernel_1_base_class<2UL> *in_stack_00000008;
  mfp_kernel_1_base_class<2UL> *in_stack_00000010;
  mfp_kernel_1_base_class<2UL> *in_stack_ffffffffffffffe0;
  
  mfp_kernel_1_base_class(in_stack_ffffffffffffffe0);
  swap(in_stack_00000010,in_stack_00000008);
  ~mfp_kernel_1_base_class((mfp_kernel_1_base_class<2UL> *)0x29eacb);
  return;
}

Assistant:

void clear(
        ) { mfp_kernel_1_base_class().swap(*this); }